

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.h
# Opt level: O1

BBlockInfo * __thiscall
dg::dda::MemorySSATransformation::getBBlockInfo(MemorySSATransformation *this,RWBBlock *b)

{
  SubgraphInfo *this_00;
  BBlockInfo *pBVar1;
  
  this_00 = getSubgraphInfo(this,*(RWSubgraph **)(b + 0x50));
  if (this_00 != (SubgraphInfo *)0x0) {
    pBVar1 = SubgraphInfo::getBBlockInfo(this_00,b);
    return pBVar1;
  }
  return (BBlockInfo *)0x0;
}

Assistant:

const BBlockInfo *getBBlockInfo(RWBBlock *b) const {
        const auto *si = getSubgraphInfo(b->getSubgraph());
        if (si) {
            return si->getBBlockInfo(b);
        }
        return nullptr;
    }